

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O1

void __thiscall
IntrusiveList<CoroutineStateData>::push_back
          (IntrusiveList<CoroutineStateData> *this,CoroutineStateData *node)

{
  CoroutineStateData **ppCVar1;
  bool bVar2;
  
  if (node == (CoroutineStateData *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0xf,
                  "void IntrusiveList<CoroutineStateData>::push_back(T *) [T = CoroutineStateData]")
    ;
  }
  if (node->next == (CoroutineStateData *)0x0) {
    if (node->listed != true) {
      node->listed = true;
      bVar2 = this->head != (CoroutineStateData *)0x0;
      ppCVar1 = &this->tail->next;
      if (!bVar2) {
        ppCVar1 = &this->tail;
      }
      *ppCVar1 = node;
      (&this->head)[bVar2] = node;
      return;
    }
    __assert_fail("!node->listed",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0x11,
                  "void IntrusiveList<CoroutineStateData>::push_back(T *) [T = CoroutineStateData]")
    ;
  }
  __assert_fail("node->next == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x10,
                "void IntrusiveList<CoroutineStateData>::push_back(T *) [T = CoroutineStateData]");
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}